

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O2

void __thiscall sentencepiece::NormalizerSpec::SharedDtor(NormalizerSpec *this)

{
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->name_,(string *)&google::protobuf::internal::fixed_address_empty_string);
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->precompiled_charsmap_,
             (string *)&google::protobuf::internal::fixed_address_empty_string);
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->normalization_rule_tsv_,
             (string *)&google::protobuf::internal::fixed_address_empty_string);
  return;
}

Assistant:

void NormalizerSpec::SharedDtor() {
  GOOGLE_DCHECK(GetArena() == nullptr);
  name_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  precompiled_charsmap_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  normalization_rule_tsv_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
}